

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmMakefileTargetGenerator::GetResponseFlag_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,ResponseFlagFor mode)

{
  cmGeneratorTarget *this_00;
  cmValue cVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string responseFlagVar;
  string lang;
  string local_c0;
  string local_a0;
  string local_80;
  undefined8 local_60;
  char *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"@","");
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  GetConfigName_abi_cxx11_(&local_80,this);
  cmGeneratorTarget::GetLinkerLanguage(&local_a0,this_00,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (mode == DeviceLink) {
    std::__cxx11::string::_M_replace((ulong)&local_c0,0,(char *)local_c0._M_string_length,0x7067a6);
  }
  else if (mode == Link) {
    local_80._M_dataplus._M_p = (pointer)0x6;
    local_80._M_string_length = 0x6e4e51;
    local_80.field_2._M_allocated_capacity = local_a0._M_string_length;
    local_80.field_2._8_8_ = local_a0._M_dataplus._M_p;
    local_60 = 0x18;
    local_58 = "_RESPONSE_FILE_LINK_FLAG";
    views._M_len = 3;
    views._M_array = (iterator)&local_80;
    cmCatViews_abi_cxx11_(&local_50,views);
    std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  cVar1 = cmMakefile::GetDefinition((this->super_cmCommonTargetGenerator).Makefile,&local_c0);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetResponseFlag(
  ResponseFlagFor mode) const
{
  std::string responseFlag = "@";
  std::string responseFlagVar;

  auto lang = this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  if (mode == cmMakefileTargetGenerator::ResponseFlagFor::Link) {
    responseFlagVar = cmStrCat("CMAKE_", lang, "_RESPONSE_FILE_LINK_FLAG");
  } else if (mode == cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink) {
    responseFlagVar = "CMAKE_CUDA_RESPONSE_FILE_DEVICE_LINK_FLAG";
  }

  if (cmValue p = this->Makefile->GetDefinition(responseFlagVar)) {
    responseFlag = *p;
  }
  return responseFlag;
}